

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_6::LineBufferTaskIIF::execute(LineBufferTaskIIF *this)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  reference pvVar4;
  reference pvVar5;
  LogicExc *this_00;
  long in_RDI;
  exception *e;
  size_t i_1;
  unsigned_short *readPointers [8];
  size_t channels;
  unsigned_short *writePtrRight;
  unsigned_short *writePtrLeft;
  size_t pixelsToCopyNormal;
  size_t pixelsToCopySSE;
  char *readPtr;
  int y;
  int dy;
  int yStop;
  int yStart;
  int i;
  int maxY;
  size_t uncompressedSize;
  size_t *in_stack_fffffffffffffec8;
  unsigned_short **in_stack_fffffffffffffed0;
  unsigned_short **in_stack_fffffffffffffed8;
  unsigned_short **in_stack_fffffffffffffee0;
  unsigned_short **in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  unsigned_short in_stack_fffffffffffffef6;
  size_t *in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff18;
  size_t *outPixelsToCopyNormal;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  LineBufferTaskIIF *in_stack_ffffffffffffff40;
  size_type local_b0;
  long local_a8 [4];
  unsigned_short *local_88;
  unsigned_short *local_80;
  unsigned_short *local_78 [2];
  size_type local_68;
  long local_60;
  undefined8 local_58;
  size_t local_50;
  long local_48;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_18;
  int local_14;
  ulong local_10;
  
  if (**(long **)(in_RDI + 0x18) == 0) {
    local_10 = 0;
    piVar3 = std::min<int>((int *)(*(long *)(in_RDI + 0x18) + 0x18),
                           (int *)(*(long *)(in_RDI + 0x10) + 0xa8));
    local_14 = *piVar3;
    for (local_18 = *(int *)(*(long *)(in_RDI + 0x18) + 0x14) -
                    *(int *)(*(long *)(in_RDI + 0x10) + 0xa4);
        local_18 <= local_14 - *(int *)(*(long *)(in_RDI + 0x10) + 0xa4); local_18 = local_18 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RDI + 0x10) + 0xd0),(long)local_18);
      local_10 = *pvVar4 + local_10;
    }
    if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x20) == 0) ||
       (local_10 <= (ulong)(long)*(int *)(*(long *)(in_RDI + 0x18) + 0x10))) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x28) = 1;
      **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8);
    }
    else {
      in_stack_ffffffffffffff34 =
           (**(code **)(**(long **)(*(long *)(in_RDI + 0x18) + 0x20) + 0x18))();
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x28) = in_stack_ffffffffffffff34;
      lVar1 = *(long *)(in_RDI + 0x18);
      in_stack_ffffffffffffff30 =
           (**(code **)(**(long **)(lVar1 + 0x20) + 0x30))
                     (*(long **)(lVar1 + 0x20),*(undefined8 *)(lVar1 + 8),
                      *(undefined4 *)(lVar1 + 0x10),*(undefined4 *)(lVar1 + 0x14));
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x10) = in_stack_ffffffffffffff30;
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x98) == 0) {
    local_28 = *(int *)(in_RDI + 0x20);
    local_2c = *(int *)(in_RDI + 0x24) + 1;
    local_30 = 1;
  }
  else {
    local_28 = *(int *)(in_RDI + 0x24);
    local_2c = *(int *)(in_RDI + 0x20) + -1;
    local_30 = -1;
  }
  local_34 = local_28;
  do {
    if (local_34 == local_2c) {
      return;
    }
    iVar2 = Imath_2_5::modp((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (int)in_stack_fffffffffffffed0);
    if (iVar2 == 0) {
      outPixelsToCopyNormal = (size_t *)**(long **)(in_RDI + 0x18);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RDI + 0x10) + 0xe8),
                          (long)(local_34 - *(int *)(*(long *)(in_RDI + 0x10) + 0xa4)));
      local_40 = (long)outPixelsToCopyNormal + *pvVar4;
      local_48 = 0;
      local_50 = 0;
      local_58 = 0;
      local_60 = 0;
      local_68 = std::
                 vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                         *)(*(long *)(in_RDI + 0x10) + 0x150));
      if (local_68 < 5) {
        getWritePointer<half>
                  (in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20),
                   (unsigned_short **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (size_t *)CONCAT44(iVar2,in_stack_ffffffffffffff28),outPixelsToCopyNormal,
                   (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      }
      else {
        getWritePointerStereo<half>
                  ((LineBufferTaskIIF *)
                   CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,(size_t *)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8);
      }
      if (((local_60 != 0) || (local_48 != 0)) || (local_50 != 0)) {
        for (local_b0 = 0; local_b0 < local_68; local_b0 = local_b0 + 1) {
          in_stack_ffffffffffffff18 = local_40;
          pvVar5 = std::
                   vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                   ::operator[]((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                                 *)(*(long *)(in_RDI + 0x10) + 0x150),local_b0);
          local_a8[local_b0] =
               in_stack_ffffffffffffff18 + pvVar5->offset * (local_48 * 8 + local_50) * 2;
        }
        if ((local_68 == 3) || (local_68 == 6)) {
          optimizedWriteToRGB((unsigned_short **)
                              CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed8,(size_t *)in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffec8);
          if (local_68 == 6) {
            optimizedWriteToRGB((unsigned_short **)
                                CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                in_stack_fffffffffffffed8,(size_t *)in_stack_fffffffffffffed0,
                                in_stack_fffffffffffffec8);
          }
        }
        else {
          if ((local_68 != 4) && (local_68 != 8)) {
            this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::LogicExc::LogicExc(this_00,"IIF mode called with incorrect channel pattern");
            __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
          }
          pvVar5 = std::
                   vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                   ::operator[]((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                                 *)(*(long *)(in_RDI + 0x10) + 0x150),3);
          if ((pvVar5->fill & 1U) == 0) {
            in_stack_fffffffffffffec8 = &local_50;
            optimizedWriteToRGBA
                      ((unsigned_short **)
                       CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                       ,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                       in_stack_ffffffffffffff00);
          }
          else {
            in_stack_ffffffffffffff00 = (size_t *)(local_a8 + 1);
            pvVar5 = std::
                     vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ::operator[]((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                                   *)(*(long *)(in_RDI + 0x10) + 0x150),3);
            half::bits(&pvVar5->fillValue);
            in_stack_fffffffffffffec8 = &local_50;
            optimizedWriteToRGBAFillA
                      ((unsigned_short **)
                       CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (unsigned_short *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffec8,in_stack_ffffffffffffff00);
          }
          if (local_68 == 8) {
            pvVar5 = std::
                     vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ::operator[]((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                                   *)(*(long *)(in_RDI + 0x10) + 0x150),7);
            if ((pvVar5->fill & 1U) == 0) {
              in_stack_fffffffffffffec8 = &local_50;
              optimizedWriteToRGBA
                        ((unsigned_short **)
                         CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_ffffffffffffff00);
            }
            else {
              in_stack_fffffffffffffed8 = &local_88;
              in_stack_fffffffffffffee0 = &local_80;
              in_stack_fffffffffffffee8 = local_78;
              pvVar5 = std::
                       vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                       ::operator[]((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                                     *)(*(long *)(in_RDI + 0x10) + 0x150),7);
              in_stack_fffffffffffffef6 = half::bits(&pvVar5->fillValue);
              in_stack_fffffffffffffec8 = &local_50;
              optimizedWriteToRGBAFillA
                        ((unsigned_short **)
                         CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         (unsigned_short *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_ffffffffffffff00);
            }
          }
        }
      }
    }
    local_34 = local_30 + local_34;
  } while( true );
}

Assistant:

void
LineBufferTaskIIF::execute()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //
        
        if (_lineBuffer->uncompressedData == 0)
        {
            size_t uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);
            
            for (int i = _lineBuffer->minY - _ifd->minY;
            i <= maxY - _ifd->minY;
            ++i)
            {
                uncompressedSize += _ifd->bytesPerLine[i];
            }
            
            if (_lineBuffer->compressor &&
                static_cast<size_t>(_lineBuffer->dataSize) < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();
                
                _lineBuffer->dataSize =
                _lineBuffer->compressor->uncompress (_lineBuffer->buffer,
                                                     _lineBuffer->dataSize,
                                                     _lineBuffer->minY,
                                                     _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //
                
                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }
        
        int yStart, yStop, dy;
        
        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }
        
        for (int y = yStart; y != yStop; y += dy)
        {
            if (modp (y, _optimizationMode._ySampling) != 0)
                continue;
            
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //
            
            // Set the readPtr to read at the start of uncompressedData
            // but with an offet based on calculated array.
            // _ifd->offsetInLineBuffer contains offsets based on which
            // line we are currently processing.
            // Stride will be taken into consideration later.
                
                
            const char* readPtr = _lineBuffer->uncompressedData +
            _ifd->offsetInLineBuffer[y - _ifd->minY];
            
            size_t pixelsToCopySSE = 0;
            size_t pixelsToCopyNormal = 0;
            
            unsigned short* writePtrLeft = 0;
            unsigned short* writePtrRight = 0;
            
            size_t channels = _ifd->optimizationData.size();
       
            if(channels>4)
            {
                getWritePointerStereo<half>(y, writePtrRight, writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
            }
            else 
            {
                getWritePointer<half>(y, writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
            }
            
            if (writePtrRight == 0 && pixelsToCopySSE == 0 && pixelsToCopyNormal == 0)
            {
                continue;
            }
            
            
            //
            // support reading up to eight channels
            //
            unsigned short* readPointers[8];
            
            for (size_t i = 0; i < channels ; ++i)
            {
                readPointers[i] = (unsigned short*)readPtr + (_ifd->optimizationData[i].offset * (pixelsToCopySSE * 8 + pixelsToCopyNormal));
            }
            
            //RGB only
            if(channels==3 || channels == 6 )
            {
                    optimizedWriteToRGB(readPointers[0], readPointers[1], readPointers[2], writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                  
                    //stereo RGB
                    if( channels == 6)
                    {
                        optimizedWriteToRGB(readPointers[3], readPointers[4], readPointers[5], writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }                
            //RGBA
            }else if(channels==4 || channels==8)
            {
                
                if(_ifd->optimizationData[3].fill)
                {
                    optimizedWriteToRGBAFillA(readPointers[0], readPointers[1], readPointers[2], _ifd->optimizationData[3].fillValue.bits() , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }else{
                    optimizedWriteToRGBA(readPointers[0], readPointers[1], readPointers[2], readPointers[3] , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }
                
                //stereo RGBA
                if( channels == 8)
                {
                    if(_ifd->optimizationData[7].fill)
                    {
                        optimizedWriteToRGBAFillA(readPointers[4], readPointers[5], readPointers[6], _ifd->optimizationData[7].fillValue.bits() , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }else{
                        optimizedWriteToRGBA(readPointers[4], readPointers[5], readPointers[6], readPointers[7] , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }
                }
            }
            else {
                throw(IEX_NAMESPACE::LogicExc("IIF mode called with incorrect channel pattern"));
            }
            
            // If we are in NO_OPTIMIZATION mode, this class will never
            // get instantiated, so no need to check for it and duplicate
            // the code.
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}